

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

CURLcode mqtt_doing(Curl_easy *data,_Bool *done)

{
  size_t *psVar1;
  uint *puVar2;
  smb_conn_state sVar3;
  uint uVar4;
  connectdata *pcVar5;
  curl_trc_feat *pcVar6;
  _Bool *p_Var7;
  byte bVar8;
  CURLcode CVar9;
  CURLcode CVar10;
  int iVar11;
  size_t len;
  char *pcVar12;
  size_t sVar13;
  uchar encoded;
  size_t blen;
  ulong uVar14;
  connectdata *conn;
  long lVar15;
  size_t __n;
  size_t mult;
  MQTT *pMVar16;
  dynbuf *s;
  size_t sVar17;
  bool bVar18;
  uchar recvbyte;
  char cStack_105f;
  undefined6 uStack_105e;
  char local_1054 [4];
  connectdata *local_1050;
  size_t local_1048;
  _Bool *local_1040;
  ssize_t nread;
  
  pcVar5 = data->conn;
  pMVar16 = (data->req).p.mqtt;
  *done = false;
  if (pMVar16->nsend != 0) {
    pcVar12 = pMVar16->sendleftovers;
    CVar9 = mqtt_send(data,pcVar12,pMVar16->nsend);
    (*Curl_cfree)(pcVar12);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
  }
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level)))) {
    Curl_infof(data,"mqtt_doing: state [%d]",(ulong)(pcVar5->proto).smbc.state);
  }
  switch((pcVar5->proto).smbc.state) {
  case SMB_NOT_CONNECTED:
    CVar9 = Curl_xfer_recv(data,(char *)&pMVar16->firstbyte,1,&nread);
    if (CVar9 != CURLE_OK) break;
    if (nread == 0) {
      Curl_failf(data,"Connection disconnected");
      *done = true;
      return CURLE_RECV_ERROR;
    }
    Curl_debug(data,CURLINFO_HEADER_IN,(char *)&pMVar16->firstbyte,1);
    pMVar16->npacket = 0;
    (data->conn->proto).smbc.state = SMB_CONNECTING;
  case SMB_CONNECTING:
    lVar15 = 1;
    local_1050 = pcVar5;
    local_1040 = done;
    do {
      CVar10 = Curl_xfer_recv(data,(char *)&recvbyte,1,&nread);
      bVar18 = CVar10 == CURLE_OK;
      if ((!bVar18) || (nread == 0)) goto LAB_0013f5a2;
      Curl_debug(data,CURLINFO_HEADER_IN,(char *)&recvbyte,1);
      sVar17 = pMVar16->npacket;
      pMVar16->npacket = sVar17 + 1;
      pMVar16->pkt_hd[sVar17] = recvbyte;
    } while (((char)recvbyte < '\0') && (pMVar16->npacket < 4));
    bVar18 = true;
LAB_0013f5a2:
    p_Var7 = local_1040;
    CVar9 = recvbyte >> 4 & CURLE_WEIRD_SERVER_REPLY;
    if (nread == 0) {
      CVar9 = CVar10;
    }
    if (!bVar18) {
      CVar9 = CVar10;
    }
    if (CVar9 == CURLE_OK) {
      bVar8 = 0x80;
      sVar17 = 0;
      uVar14 = 0;
      while ((uVar14 < pMVar16->npacket && ((char)bVar8 < '\0'))) {
        bVar8 = pMVar16->pkt_hd[uVar14];
        sVar17 = sVar17 + (ulong)(bVar8 & 0x7f) * lVar15;
        lVar15 = lVar15 << 7;
        uVar14 = uVar14 + 1;
      }
      pMVar16->remaining_length = sVar17;
      pMVar16->npacket = 0;
      if (sVar17 != 0) {
        sVar3 = (local_1050->proto).mqtt.nextstate;
        pcVar5 = data->conn;
        (pcVar5->proto).smbc.state = sVar3;
        if (sVar3 != SMB_NOT_CONNECTED) {
          return CURLE_OK;
        }
        (pcVar5->proto).mqtt.nextstate = MQTT_NOSTATE;
        return CURLE_OK;
      }
      (data->conn->proto).ftpc.pp.nread_resp = 0;
      if (pMVar16->firstbyte != 0xe0) {
        return CURLE_OK;
      }
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        Curl_infof(data,"Got DISCONNECT");
      }
      *p_Var7 = true;
      return CURLE_OK;
    }
    break;
  case SMB_NEGOTIATE:
    pMVar16 = (data->req).p.mqtt;
    CVar9 = mqtt_recv_atleast(data,2);
    if (CVar9 != CURLE_OK) break;
    s = &pMVar16->recvbuf;
    pcVar12 = Curl_dyn_ptr(s);
    Curl_debug(data,CURLINFO_HEADER_IN,pcVar12,2);
    if (*pcVar12 != '\0' || pcVar12[1] != '\0') {
      Curl_failf(data,"Expected %02x%02x but got %02x%02x",0,0,(ulong)(uint)(int)*pcVar12,
                 (ulong)(uint)(int)pcVar12[1]);
      Curl_dyn_reset(s);
      return CURLE_WEIRD_SERVER_REPLY;
    }
    mqtt_recv_consume(data,2);
    if ((data->state).httpreq == '\x01') {
      pcVar12 = (char *)(data->set).postfields;
      nread = 0;
      if (pcVar12 == (char *)0x0) {
        CVar9 = CURLE_BAD_FUNCTION_ARGUMENT;
      }
      else {
        sVar13 = (data->set).postfieldsize;
        if ((long)sVar13 < 0) {
          sVar13 = strlen(pcVar12);
        }
        CVar9 = mqtt_get_topic(data,(char **)&nread,(size_t *)&recvbyte);
        if (CVar9 == CURLE_OK) {
          lVar15 = CONCAT62(uStack_105e,CONCAT11(cStack_105f,recvbyte));
          local_1050 = (connectdata *)pcVar12;
          iVar11 = mqtt_encode_len(local_1054,sVar13 + lVar15 + 2);
          __n = (size_t)iVar11;
          pcVar12 = (char *)(*Curl_cmalloc)(__n + sVar13 + lVar15 + 3);
          if (pcVar12 == (char *)0x0) {
            CVar9 = CURLE_OUT_OF_MEMORY;
            goto LAB_0013f440;
          }
          *pcVar12 = '0';
          local_1048 = sVar13;
          memcpy(pcVar12 + 1,local_1054,__n);
          pcVar12[__n + 1] = cStack_105f;
          pcVar12[__n + 2] = recvbyte;
          memcpy(pcVar12 + __n + 3,(void *)nread,
                 CONCAT62(uStack_105e,CONCAT11(cStack_105f,recvbyte)));
          sVar13 = local_1048;
          lVar15 = __n + 3 + CONCAT62(uStack_105e,CONCAT11(cStack_105f,recvbyte));
          memcpy(pcVar12 + lVar15,local_1050,local_1048);
          CVar9 = mqtt_send(data,pcVar12,lVar15 + sVar13);
        }
        else {
LAB_0013f440:
          pcVar12 = (char *)0x0;
        }
        (*Curl_cfree)(pcVar12);
        (*Curl_cfree)((void *)nread);
        if (CVar9 == CURLE_OK) {
          pMVar16 = (data->req).p.mqtt;
          CVar9 = mqtt_send(data,anon_var_dwarf_e9227,2);
          (*Curl_cfree)(pMVar16->sendleftovers);
          pMVar16->sendleftovers = (char *)0x0;
          Curl_dyn_free(&pMVar16->recvbuf);
          *done = true;
        }
      }
      (pcVar5->proto).mqtt.nextstate = MQTT_FIRST;
      break;
    }
    nread = 0;
    pcVar5 = data->conn;
    CVar9 = mqtt_get_topic(data,(char **)&nread,(size_t *)&recvbyte);
    if (CVar9 == CURLE_OK) {
      puVar2 = &(pcVar5->proto).mqtt.packetid;
      *puVar2 = *puVar2 + 1;
      lVar15 = CONCAT62(uStack_105e,CONCAT11(cStack_105f,recvbyte));
      iVar11 = mqtt_encode_len(local_1054,lVar15 + 5);
      sVar13 = (size_t)iVar11;
      sVar17 = sVar13 + lVar15 + 6;
      pcVar12 = (char *)(*Curl_cmalloc)(sVar17);
      if (pcVar12 == (char *)0x0) {
        CVar9 = CURLE_OUT_OF_MEMORY;
        goto LAB_0013f84b;
      }
      *pcVar12 = -0x7e;
      memcpy(pcVar12 + 1,local_1054,sVar13);
      pcVar12[sVar13 + 1] = *(char *)((long)&pcVar5->proto + 9);
      pcVar12[sVar13 + 2] = *(char *)((long)&pcVar5->proto + 8);
      pcVar12[sVar13 + 3] = cStack_105f;
      pcVar12[sVar13 + 4] = recvbyte;
      memcpy(pcVar12 + sVar13 + 5,(void *)nread,CONCAT62(uStack_105e,CONCAT11(cStack_105f,recvbyte))
            );
      pcVar12[CONCAT62(uStack_105e,CONCAT11(cStack_105f,recvbyte)) + 5 + sVar13] = '\0';
      CVar9 = mqtt_send(data,pcVar12,sVar17);
    }
    else {
LAB_0013f84b:
      pcVar12 = (char *)0x0;
    }
    (*Curl_cfree)((void *)nread);
    (*Curl_cfree)(pcVar12);
    if (CVar9 == CURLE_OK) {
      (data->conn->proto).ftpc.pp.nread_resp = 0x300000000;
      return CURLE_OK;
    }
    break;
  case SMB_SETUP:
  case SMB_CONNECTED|SMB_CONNECTING:
  case SMB_CONNECTED|SMB_NEGOTIATE:
    pcVar5 = data->conn;
    sVar3 = (pcVar5->proto).smbc.state;
    if (3 < sVar3 - SMB_SETUP) {
LAB_0013f383:
      CVar9 = CURLE_WEIRD_SERVER_REPLY;
      break;
    }
    pMVar16 = (data->req).p.mqtt;
    switch(sVar3) {
    default:
      bVar8 = pMVar16->firstbyte & 0xf0;
      if (bVar8 == 0x30) {
        (pcVar5->proto).smbc.state = SMB_CONNECTED|SMB_NEGOTIATE;
        sVar17 = pMVar16->remaining_length;
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))
           )) {
          Curl_infof(data,"Remaining length: %zu bytes",sVar17);
        }
        lVar15 = (data->set).max_filesize;
        if (lVar15 < (long)sVar17 && lVar15 != 0) {
          Curl_failf(data,"Maximum file size exceeded");
          CVar9 = CURLE_FILESIZE_EXCEEDED;
          goto LAB_0013fa80;
        }
        Curl_pgrsSetDownloadSize(data,sVar17);
        (data->req).bytecount = 0;
        (data->req).size = sVar17;
        pMVar16->npacket = sVar17;
        goto LAB_0013f490;
      }
      if (bVar8 != 0xe0) {
        if (bVar8 != 0x90) goto LAB_0013f383;
        (pcVar5->proto).smbc.state = SMB_CONNECTED;
        pMVar16 = (data->req).p.mqtt;
        goto switchD_0013f2ea_caseD_4;
      }
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        Curl_infof(data,"Got DISCONNECT");
      }
      *done = true;
      break;
    case SMB_CONNECTED:
switchD_0013f2ea_caseD_4:
      CVar9 = mqtt_recv_atleast(data,3);
      if (CVar9 != CURLE_OK) goto LAB_0013fa80;
      pcVar12 = Curl_dyn_ptr(&pMVar16->recvbuf);
      Curl_debug(data,CURLINFO_HEADER_IN,pcVar12,3);
      uVar4 = (pcVar5->proto).mqtt.packetid;
      if (((*pcVar12 != (char)(uVar4 >> 8)) || (pcVar12[1] != (char)uVar4)) || (pcVar12[2] != '\0'))
      {
        Curl_dyn_reset(&pMVar16->recvbuf);
        goto LAB_0013f383;
      }
      mqtt_recv_consume(data,3);
      (data->conn->proto).tftpc = (tftp_state_data *)0x500000000;
      break;
    case SMB_CONNECTED|SMB_NEGOTIATE:
      sVar17 = pMVar16->npacket;
LAB_0013f490:
      blen = 0x1000;
      if (sVar17 < 0x1000) {
        blen = sVar17;
      }
      CVar9 = Curl_xfer_recv(data,(char *)&nread,blen,(ssize_t *)&recvbyte);
      if (CVar9 == CURLE_OK) {
        sVar17 = CONCAT62(uStack_105e,CONCAT11(cStack_105f,recvbyte));
        if (sVar17 != 0) {
          CVar9 = Curl_client_write(data,1,(char *)&nread,sVar17);
          if (CVar9 == CURLE_OK) {
            CVar9 = CURLE_OK;
            psVar1 = &pMVar16->npacket;
            *psVar1 = *psVar1 - CONCAT62(uStack_105e,CONCAT11(cStack_105f,recvbyte));
            if (*psVar1 == 0) {
              (data->conn->proto).tftpc = (tftp_state_data *)0x500000000;
            }
          }
          goto LAB_0013fa80;
        }
        CVar9 = CURLE_PARTIAL_FILE;
        if ((((data->set).field_0x8cd & 0x10) == 0) ||
           ((pcVar6 = (data->state).feat, pcVar6 != (curl_trc_feat *)0x0 && (pcVar6->log_level < 1))
           )) goto LAB_0013fa80;
        pcVar12 = "server disconnected";
      }
      else {
        if (((CVar9 != CURLE_AGAIN) || (CVar9 = CURLE_AGAIN, ((data->set).field_0x8cd & 0x10) == 0))
           || ((pcVar6 = (data->state).feat, pcVar6 != (curl_trc_feat *)0x0 &&
               (pcVar6->log_level < 1)))) goto LAB_0013fa80;
        pcVar12 = "EEEE AAAAGAIN";
      }
      Curl_infof(data,pcVar12);
      goto LAB_0013fa80;
    }
    CVar9 = CURLE_OK;
    break;
  default:
    Curl_failf(data,"State not handled yet");
    *done = true;
    return CURLE_OK;
  }
LAB_0013fa80:
  CVar10 = CURLE_OK;
  if (CVar9 != CURLE_AGAIN) {
    CVar10 = CVar9;
  }
  return CVar10;
}

Assistant:

static CURLcode mqtt_doing(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct mqtt_conn *mqtt = &conn->proto.mqtt;
  struct MQTT *mq = data->req.p.mqtt;
  ssize_t nread;
  unsigned char recvbyte;

  *done = FALSE;

  if(mq->nsend) {
    /* send the remainder of an outgoing packet */
    char *ptr = mq->sendleftovers;
    result = mqtt_send(data, mq->sendleftovers, mq->nsend);
    free(ptr);
    if(result)
      return result;
  }

  infof(data, "mqtt_doing: state [%d]", (int) mqtt->state);
  switch(mqtt->state) {
  case MQTT_FIRST:
    /* Read the initial byte only */
    result = Curl_xfer_recv(data, (char *)&mq->firstbyte, 1, &nread);
    if(result)
      break;
    else if(!nread) {
      failf(data, "Connection disconnected");
      *done = TRUE;
      result = CURLE_RECV_ERROR;
      break;
    }
    Curl_debug(data, CURLINFO_HEADER_IN, (char *)&mq->firstbyte, 1);
    /* remember the first byte */
    mq->npacket = 0;
    mqstate(data, MQTT_REMAINING_LENGTH, MQTT_NOSTATE);
    FALLTHROUGH();
  case MQTT_REMAINING_LENGTH:
    do {
      result = Curl_xfer_recv(data, (char *)&recvbyte, 1, &nread);
      if(result || !nread)
        break;
      Curl_debug(data, CURLINFO_HEADER_IN, (char *)&recvbyte, 1);
      mq->pkt_hd[mq->npacket++] = recvbyte;
    } while((recvbyte & 0x80) && (mq->npacket < 4));
    if(!result && nread && (recvbyte & 0x80))
      /* MQTT supports up to 127 * 128^0 + 127 * 128^1 + 127 * 128^2 +
         127 * 128^3 bytes. server tried to send more */
      result = CURLE_WEIRD_SERVER_REPLY;
    if(result)
      break;
    mq->remaining_length = mqtt_decode_len(mq->pkt_hd, mq->npacket, NULL);
    mq->npacket = 0;
    if(mq->remaining_length) {
      mqstate(data, mqtt->nextstate, MQTT_NOSTATE);
      break;
    }
    mqstate(data, MQTT_FIRST, MQTT_FIRST);

    if(mq->firstbyte == MQTT_MSG_DISCONNECT) {
      infof(data, "Got DISCONNECT");
      *done = TRUE;
    }
    break;
  case MQTT_CONNACK:
    result = mqtt_verify_connack(data);
    if(result)
      break;

    if(data->state.httpreq == HTTPREQ_POST) {
      result = mqtt_publish(data);
      if(!result) {
        result = mqtt_disconnect(data);
        *done = TRUE;
      }
      mqtt->nextstate = MQTT_FIRST;
    }
    else {
      result = mqtt_subscribe(data);
      if(!result) {
        mqstate(data, MQTT_FIRST, MQTT_SUBACK);
      }
    }
    break;

  case MQTT_SUBACK:
  case MQTT_PUBWAIT:
  case MQTT_PUB_REMAIN:
    result = mqtt_read_publish(data, done);
    break;

  default:
    failf(data, "State not handled yet");
    *done = TRUE;
    break;
  }

  if(result == CURLE_AGAIN)
    result = CURLE_OK;
  return result;
}